

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio_io.c
# Opt level: O1

ALLEGRO_SAMPLE * al_load_sample_f(ALLEGRO_FILE *fp,char *ident)

{
  char cVar1;
  ACODEC_TABLE *pAVar2;
  ALLEGRO_SAMPLE *pAVar3;
  
  pAVar2 = find_acodec_table_entry(ident);
  if ((pAVar2 != (ACODEC_TABLE *)0x0) &&
     (pAVar2->fs_loader != (_func_ALLEGRO_SAMPLE_ptr_ALLEGRO_FILE_ptr *)0x0)) {
    pAVar3 = (*pAVar2->fs_loader)(fp);
    return pAVar3;
  }
  cVar1 = _al_trace_prefix("audio",3,
                           "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/audio_io.c"
                           ,0x123,"al_load_sample_f");
  if (cVar1 != '\0') {
    _al_trace_suffix("No handler for audio file extension %s.\n",ident);
  }
  return (ALLEGRO_SAMPLE *)0x0;
}

Assistant:

ALLEGRO_SAMPLE *al_load_sample_f(ALLEGRO_FILE* fp, const char *ident)
{
   ACODEC_TABLE *ent;

   ASSERT(fp);
   ASSERT(ident);

   ent = find_acodec_table_entry(ident);
   if (ent && ent->fs_loader) {
      return (ent->fs_loader)(fp);
   }
   else {
      ALLEGRO_ERROR("No handler for audio file extension %s.\n", ident);
   }

   return NULL;
}